

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O0

void __thiscall
BSP<int>::swapVectors
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *a,vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *b)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  reference this_00;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *in_RDX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RSI;
  size_t i_1;
  size_t i;
  int bSize;
  int aSize;
  LockableVector<int> *in_stack_ffffffffffffffd0;
  ulong uVar5;
  ulong __n;
  size_type in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *targetVector;
  vector<int,_std::allocator<int>_> *__n_00;
  
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(in_RSI);
  iVar1 = (int)sVar3;
  sVar3 = std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::size(in_RDX);
  iVar2 = (int)sVar3;
  if (iVar2 < iVar1) {
    std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize
              ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
               CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffd8);
  }
  else if (iVar1 < iVar2) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffd8);
  }
  targetVector = (vector<int,_std::allocator<int>_> *)0x0;
  while (__n_00 = targetVector,
        pvVar4 = (vector<int,_std::allocator<int>_> *)
                 std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::size
                           (in_RDX), targetVector < pvVar4) {
    std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::operator[]
              (in_RDX,(size_type)__n_00);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](in_RSI,(size_type)__n_00);
    LockableVector<int>::swap(in_stack_ffffffffffffffd0,targetVector);
    targetVector = (vector<int,_std::allocator<int>_> *)
                   ((long)&(__n_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1);
  }
  uVar5 = 0;
  while (__n = uVar5,
        sVar3 = std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::size
                          (in_RDX), uVar5 < sVar3) {
    this_00 = std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::operator[]
                        (in_RDX,__n);
    LockableVector<int>::getVector(this_00);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x10f336);
    uVar5 = __n + 1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::shrink_to_fit((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)0x10f350);
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::shrink_to_fit
            ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)0x10f35a);
  return;
}

Assistant:

void BSP<T>::swapVectors (std::vector<std::vector<T>> &a, std::vector<LockableVector<T>> &b) {
	int aSize	= a.size ();
	int bSize	= b.size ();

	// Checking if vectors have different sizes
	if (aSize > bSize) {
		b.resize (aSize);
	}
	else if ( aSize < bSize) {
		a.resize (bSize);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].swap (a[i]);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].getVector().clear ();
	}

	a.shrink_to_fit ();
	b.shrink_to_fit ();
}